

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

double __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_double(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  size_t *psVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  size_t sVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint8_t b;
  uint8_t buf [4];
  uint8_t buf_1 [8];
  byte local_15;
  uint local_14;
  ulong local_10;
  
  pbVar6 = (this->source_).current_._M_current;
  pbVar3 = (this->source_).end_._M_current;
  uVar7 = (ulong)(pbVar3 != pbVar6);
  if (pbVar3 == pbVar6) {
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + uVar7;
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
    return 0.0;
  }
  pbVar2 = pbVar6 + uVar7;
  uVar9 = 0;
  pbVar4 = pbVar6;
  do {
    (this->source_).current_._M_current = pbVar4 + 1;
    (&local_15)[uVar9] = *pbVar4;
    uVar9 = uVar9 + 1;
    pbVar4 = pbVar4 + 1;
  } while (uVar7 != uVar9);
  sVar5 = (this->source_).position_ + uVar7;
  (this->source_).position_ = sVar5;
  if ((local_15 & 0x1f) == 0x1b) {
    uVar9 = 8;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 8) {
      uVar9 = (long)pbVar3 - (long)pbVar2;
    }
    if (pbVar3 != pbVar2) {
      uVar8 = 0;
      pbVar6 = pbVar6 + uVar7;
      do {
        (this->source_).current_._M_current = pbVar6 + 1;
        *(byte *)((long)&local_10 + uVar8) = *pbVar6;
        uVar8 = uVar8 + 1;
        pbVar6 = pbVar6 + 1;
      } while (uVar9 != uVar8);
      (this->source_).position_ = uVar9 + sVar5;
      if (7 < (ulong)((long)pbVar3 - (long)pbVar2)) {
        return (double)(local_10 >> 0x38 | (local_10 & 0xff000000000000) >> 0x28 |
                        (local_10 & 0xff0000000000) >> 0x18 | (local_10 & 0xff00000000) >> 8 |
                        (local_10 & 0xff000000) << 8 | (local_10 & 0xff0000) << 0x18 |
                        (local_10 & 0xff00) << 0x28 | local_10 << 0x38);
      }
      goto LAB_0029a0e7;
    }
  }
  else {
    if ((local_15 & 0x1f) != 0x1a) {
      return 0.0;
    }
    uVar9 = 4;
    if ((ulong)((long)pbVar3 - (long)pbVar2) < 4) {
      uVar9 = (long)pbVar3 - (long)pbVar2;
    }
    if (pbVar3 != pbVar2) {
      uVar8 = 0;
      pbVar6 = pbVar6 + uVar7;
      do {
        (this->source_).current_._M_current = pbVar6 + 1;
        *(byte *)((long)&local_14 + uVar8) = *pbVar6;
        uVar8 = uVar8 + 1;
        pbVar6 = pbVar6 + 1;
      } while (uVar9 != uVar8);
      (this->source_).position_ = uVar9 + sVar5;
      if (3 < (ulong)((long)pbVar3 - (long)pbVar2)) {
        return (double)(float)(local_14 >> 0x18 | (local_14 & 0xff0000) >> 8 |
                               (local_14 & 0xff00) << 8 | local_14 << 0x18);
      }
      goto LAB_0029a0e7;
    }
  }
  (this->source_).position_ = uVar9 + sVar5;
LAB_0029a0e7:
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return 0.0;
}

Assistant:

double get_double(std::error_code& ec)
    {
        double val = 0;

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return 0;
        }
        uint8_t info = get_additional_information_value(b);
        switch (info)
        {
        case 0x1a: // Single-Precision Float (four-byte IEEE 754)
            {
                uint8_t buf[sizeof(float)];
                if (source_.read(buf, sizeof(float)) !=sizeof(float)) 
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<float>(buf, sizeof(buf));
                break;
            }

        case 0x1b: //  Double-Precision Float (eight-byte IEEE 754)
            {
                uint8_t buf[sizeof(double)];
                if (source_.read(buf, sizeof(double)) != sizeof(double))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<double>(buf, sizeof(buf));
                break;
            }
            default:
                break;
        }
        
        return val;
    }